

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryOperator.cpp
# Opt level: O2

ptr<Value> __thiscall BinaryOperator::evaluate(BinaryOperator *this,Environment *env)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar2;
  ptr<Value> rightValue;
  ptr<Value> leftValue;
  undefined1 auStack_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_bucket_count)(local_28);
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_element_count)(auStack_38);
  plVar1 = (long *)(env->symbols)._M_h._M_rehash_policy._M_next_resize;
  (**(code **)(*plVar1 + 0x30))(this,plVar1,local_28,auStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> BinaryOperator::evaluate(Environment* env) {
    ptr<Value> leftValue = leftExpression->evaluate(env);
    ptr<Value> rightValue = rightExpression->evaluate(env);

    ptr<Value> result = operation -> getResult(leftValue, rightValue);
    return result;
}